

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void __thiscall QDateTime::setOffsetFromUtc(QDateTime *this,int offsetSeconds)

{
  long in_FS_OFFSET;
  Data local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d = (QTimeZonePrivate *)((3 - (ulong)(offsetSeconds == 0)) + (long)offsetSeconds * 4);
  if (0x1c200 < (long)offsetSeconds + 0xe100U) {
    local_18.d = (QTimeZonePrivate *)0x0;
  }
  reviseTimeZone(&this->d,(QTimeZone *)&local_18.s,Reject);
  QTimeZone::~QTimeZone((QTimeZone *)&local_18.s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTime::setOffsetFromUtc(int offsetSeconds)
{
    reviseTimeZone(d, QTimeZone::fromSecondsAheadOfUtc(offsetSeconds),
                   TransitionResolution::Reject);
}